

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O3

void convert_mana_to_hp(player *p,int32_t sp_long)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  
  if ((0 < sp_long) && (uVar1 = p->msp, uVar1 != 0)) {
    if (p->mhp != p->chp) {
      uVar2 = 0x140000;
      if (10 < (short)uVar1) {
        uVar2 = (uint)uVar1 << 0x11;
      }
      uVar3 = 4;
      if (4 < uVar2 / (uint)sp_long) {
        uVar3 = uVar2 / (uint)sp_long;
      }
      player_adjust_hp_precise
                (p,(int)(((int)p->mhp - (int)p->chp) * 0x10000 - (uint)p->chp_frac) / (int)uVar3);
      return;
    }
  }
  return;
}

Assistant:

void convert_mana_to_hp(struct player *p, int32_t sp_long) {
	int32_t hp_gain, sp_ratio;

	if (sp_long <= 0 || p->msp == 0 || p->mhp == p->chp) return;

	/* Total HP from max */
	hp_gain = ((int32_t)(p->mhp - p->chp)) * 65536;
	hp_gain -= (int32_t)p->chp_frac;

	/* Spend X% of SP get X/2% of lost HP. E.g., at 50% HP get X/4% */
	/* Gain stays low at msp<10 because MP gains are generous at msp<10 */
	/* sp_ratio is max sp to spent sp, doubled to suit target rate. */
	sp_ratio = (((int32_t)MAX(10, (int32_t)p->msp)) * 131072) / sp_long;

	/* Limit max healing to 25% of damage; ergo spending > 50% msp
	 * is inefficient */
	if (sp_ratio < 4) {sp_ratio = 4;}
	hp_gain /= sp_ratio;

	/* DAVIDTODO Flavorful comments on large gains would be fun and informative */

	player_adjust_hp_precise(p, hp_gain);
}